

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O0

err_t EBML_ElementRenderHead
                (ebml_element *Element,stream *Output,bool_t bKeepPosition,filepos_t *Rendered)

{
  uint8_t SizeLength;
  filepos_t fVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  bool_t bVar7;
  long lVar8;
  err_t eVar9;
  filepos_t PosBefore;
  filepos_t PosAfter;
  int CodedSize;
  size_t FinalHeadSize;
  size_t i;
  uint8_t FinalHead [12];
  err_t Err;
  filepos_t *Rendered_local;
  bool_t bKeepPosition_local;
  stream *Output_local;
  ebml_element *Element_local;
  
  if (Output == (stream *)0x0) {
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                  ,0x134,
                  "err_t EBML_ElementRenderHead(ebml_element *, struct stream *, bool_t, filepos_t *)"
                 );
  }
  lVar5 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
  sVar6 = EBML_FillBufferID((uint8_t *)((long)&i + 4),0xc,Element->Context->Id);
  fVar1 = Element->DataSize;
  SizeLength = Element->SizeLength;
  bVar7 = EBML_ElementIsFiniteSize(Element);
  bVar3 = EBML_CodedSizeLength(fVar1,SizeLength,bVar7);
  uVar4 = (uint)bVar3;
  fVar1 = Element->DataSize;
  bVar7 = EBML_ElementIsFiniteSize(Element);
  EBML_CodedValueLength(fVar1,(long)(int)uVar4,(uint8_t *)((long)&i + sVar6 + 4),bVar7);
  if (Output != (stream *)0x0) {
    FinalHead._4_8_ =
         (**(code **)((long)(Output->Base).VMT + 0x70))
                   (Output,(long)&i + 4,(long)(int)uVar4 + sVar6,&FinalHeadSize);
    if (Output != (stream *)0x0) {
      lVar8 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
      if (bKeepPosition == 0) {
        Element->ElementPosition = lVar8 - ((long)(int)uVar4 + sVar6);
        lVar2 = Element->ElementPosition;
        sVar6 = GetIdLength(Element->Context->Id);
        Element->SizePosition = lVar2 + sVar6;
        Element->EndPosition = Element->SizePosition + (long)(int)uVar4 + Element->DataSize;
      }
      if (Rendered != (filepos_t *)0x0) {
        *Rendered = lVar8 - lVar5;
      }
      eVar9._0_1_ = FinalHead[4];
      eVar9._1_1_ = FinalHead[5];
      eVar9._2_1_ = FinalHead[6];
      eVar9._3_1_ = FinalHead[7];
      eVar9._4_1_ = FinalHead[8];
      eVar9._5_1_ = FinalHead[9];
      eVar9._6_1_ = FinalHead[10];
      eVar9._7_1_ = FinalHead[0xb];
      return eVar9;
    }
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                  ,0x13d,
                  "err_t EBML_ElementRenderHead(ebml_element *, struct stream *, bool_t, filepos_t *)"
                 );
  }
  __assert_fail("(const void*)(Output)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                ,0x13c,
                "err_t EBML_ElementRenderHead(ebml_element *, struct stream *, bool_t, filepos_t *)"
               );
}

Assistant:

err_t EBML_ElementRenderHead(ebml_element *Element, struct stream *Output, bool_t bKeepPosition, filepos_t *Rendered)
{
    err_t Err;
    uint8_t FinalHead[4+8]; // Class D + 64 bits coded size
    size_t i,FinalHeadSize;
    int CodedSize;
    filepos_t PosAfter,PosBefore = Stream_Seek(Output,0,SEEK_CUR);

    FinalHeadSize = EBML_FillBufferID(FinalHead,sizeof(FinalHead),Element->Context->Id);

    CodedSize = EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
    EBML_CodedValueLength(Element->DataSize, CodedSize, &FinalHead[FinalHeadSize], EBML_ElementIsFiniteSize(Element));
    FinalHeadSize += CodedSize;

    Err = Stream_Write(Output, FinalHead, FinalHeadSize, &i);
    PosAfter = Stream_Seek(Output,0,SEEK_CUR);
    if (!bKeepPosition) {
        Element->ElementPosition = PosAfter - FinalHeadSize;
        Element->SizePosition = Element->ElementPosition + GetIdLength(Element->Context->Id);
        Element->EndPosition = Element->SizePosition + CodedSize + Element->DataSize;
    }
    if (Rendered)
        *Rendered = PosAfter - PosBefore;
    return Err;
}